

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_still_impl.cpp
# Opt level: O2

string * __thiscall
raspicam::_private::Private_Impl_Still::getId_abi_cxx11_
          (string *__return_storage_ptr__,Private_Impl_Still *this)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  bool bVar4;
  string str;
  ifstream file;
  byte abStack_a90 [488];
  char aux [100];
  char serial [1024];
  char line [1024];
  
  serial[0] = '\0';
  std::ifstream::ifstream(&file,"/proc/cpuinfo",_S_in);
  lVar3 = *(long *)(_file + -0x18);
  if ((abStack_a90[lVar3] & 5) == 0) {
    bVar4 = false;
    while (((abStack_a90[lVar3] & 2) == 0 && (!bVar4))) {
      std::istream::getline((char *)&file,(long)line);
      std::__cxx11::string::string<std::allocator<char>>((string *)&str,line,(allocator<char> *)aux)
      ;
      bVar4 = false;
      lVar3 = std::__cxx11::string::find((char *)&str,0x10c5cd);
      if (lVar3 != -1) {
        iVar1 = __isoc99_sscanf(line,"%s : %s",(allocator<char> *)aux,serial);
        bVar4 = true;
        if (iVar1 != 2) {
          poVar2 = std::operator<<((ostream *)&std::cerr,
                                   "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
                                  );
          poVar2 = std::operator<<(poVar2," ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x368);
          poVar2 = std::operator<<(poVar2,":");
          poVar2 = std::operator<<(poVar2,"getId");
          poVar2 = std::operator<<(poVar2,"Error parsing /proc/cpuinfo");
          std::endl<char,std::char_traits<char>>(poVar2);
          bVar4 = false;
        }
      }
      std::__cxx11::string::~string((string *)&str);
      lVar3 = *(long *)(_file + -0x18);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,serial,(allocator<char> *)line);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "/workspace/llm4binary/github/license_c_cmakelists/rmsalinas[P]raspicam/src/private_still/private_still_impl.cpp"
                            );
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x35b);
    poVar2 = std::operator<<(poVar2,":");
    poVar2 = std::operator<<(poVar2,"getId");
    poVar2 = std::operator<<(poVar2,"Could not read /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,serial,(allocator<char> *)line);
  }
  std::ifstream::~ifstream(&file);
  return __return_storage_ptr__;
}

Assistant:

string Private_Impl_Still::getId() const{
            char serial[1024];
            serial[0]='\0';
            ifstream file ( "/proc/cpuinfo" );
            if ( !file ) {
                cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Could not read /proc/cpuinfo"<<endl;
                return serial;
            }
            //read lines until find serial
            bool found=false;
            while ( !file.eof() && !found ) {
                char line[1024];
                file.getline ( line,1024 );
                string str ( line );
                char aux[100];

                if ( str.find ( "Serial" ) !=string::npos ) {
                    if ( sscanf ( line,"%s : %s",aux,serial ) !=2 ) {
                        cerr<<__FILE__<<" "<<__LINE__<<":"<<__func__<<"Error parsing /proc/cpuinfo"<<endl;
                    } else found=true;
                }
            };
            return serial;
        }